

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O1

int jpc_sop_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  int iVar1;
  
  iVar1 = jpc_putuint16(out,(ms->parms).sot.tileno);
  return -(uint)(iVar1 != 0);
}

Assistant:

static int jpc_sop_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_sop_t *sop = &ms->parms.sop;

	/* Eliminate compiler warning about unused variable. */
	(void)cstate;

	if (jpc_putuint16(out, sop->seqno)) {
		return -1;
	}
	return 0;
}